

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

double llvm::detail::scalbn(double __x,int __n)

{
  bool bVar1;
  fltSemantics *pfVar2;
  int *piVar3;
  int in_ECX;
  IEEEFloat *in_RSI;
  undefined4 in_register_0000003c;
  double extraout_XMM0_Qa;
  int local_30;
  int local_2c;
  int local_28;
  int MaxIncrement;
  int SignificandBits;
  ExponentType MinExp;
  ExponentType MaxExp;
  roundingMode RoundingMode_local;
  int Exp_local;
  IEEEFloat *X_local;
  
  SignificandBits = in_ECX;
  X_local = (IEEEFloat *)CONCAT44(in_register_0000003c,__n);
  pfVar2 = IEEEFloat::getSemantics(in_RSI);
  MaxIncrement._2_2_ = pfVar2->maxExponent;
  pfVar2 = IEEEFloat::getSemantics(in_RSI);
  MaxIncrement._0_2_ = pfVar2->minExponent;
  pfVar2 = IEEEFloat::getSemantics(in_RSI);
  local_28 = pfVar2->precision - 1;
  local_2c = ((int)MaxIncrement._2_2_ - ((ExponentType)MaxIncrement - local_28)) + 1;
  local_30 = -1 - local_2c;
  piVar3 = std::max<int>((int *)&MinExp,&local_30);
  piVar3 = std::min<int>(piVar3,&local_2c);
  in_RSI->exponent = in_RSI->exponent + (short)*piVar3;
  IEEEFloat::normalize(in_RSI,SignificandBits,lfExactlyZero);
  bVar1 = IEEEFloat::isNaN(in_RSI);
  if (bVar1) {
    IEEEFloat::makeQuiet(in_RSI);
  }
  IEEEFloat::IEEEFloat((IEEEFloat *)CONCAT44(in_register_0000003c,__n),in_RSI);
  return extraout_XMM0_Qa;
}

Assistant:

IEEEFloat scalbn(IEEEFloat X, int Exp, IEEEFloat::roundingMode RoundingMode) {
  auto MaxExp = X.getSemantics().maxExponent;
  auto MinExp = X.getSemantics().minExponent;

  // If Exp is wildly out-of-scale, simply adding it to X.exponent will
  // overflow; clamp it to a safe range before adding, but ensure that the range
  // is large enough that the clamp does not change the result. The range we
  // need to support is the difference between the largest possible exponent and
  // the normalized exponent of half the smallest denormal.

  int SignificandBits = X.getSemantics().precision - 1;
  int MaxIncrement = MaxExp - (MinExp - SignificandBits) + 1;

  // Clamp to one past the range ends to let normalize handle overlflow.
  X.exponent += std::min(std::max(Exp, -MaxIncrement - 1), MaxIncrement);
  X.normalize(RoundingMode, lfExactlyZero);
  if (X.isNaN())
    X.makeQuiet();
  return X;
}